

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

void stbi__cleanup_jpeg(stbi__jpeg *j)

{
  int local_14;
  int i;
  stbi__jpeg *j_local;
  
  for (local_14 = 0; local_14 < j->s->img_n; local_14 = local_14 + 1) {
    if (j->img_comp[local_14].raw_data != (void *)0x0) {
      free(j->img_comp[local_14].raw_data);
      j->img_comp[local_14].raw_data = (void *)0x0;
      j->img_comp[local_14].data = (stbi_uc *)0x0;
    }
    if (j->img_comp[local_14].raw_coeff != (void *)0x0) {
      free(j->img_comp[local_14].raw_coeff);
      j->img_comp[local_14].raw_coeff = (void *)0x0;
      j->img_comp[local_14].coeff = (short *)0x0;
    }
    if (j->img_comp[local_14].linebuf != (stbi_uc *)0x0) {
      free(j->img_comp[local_14].linebuf);
      j->img_comp[local_14].linebuf = (stbi_uc *)0x0;
    }
  }
  return;
}

Assistant:

static void stbi__cleanup_jpeg(stbi__jpeg *j)
{
   int i;
   for (i=0; i < j->s->img_n; ++i) {
      if (j->img_comp[i].raw_data) {
         STBI_FREE(j->img_comp[i].raw_data);
         j->img_comp[i].raw_data = NULL;
         j->img_comp[i].data = NULL;
      }
      if (j->img_comp[i].raw_coeff) {
         STBI_FREE(j->img_comp[i].raw_coeff);
         j->img_comp[i].raw_coeff = 0;
         j->img_comp[i].coeff = 0;
      }
      if (j->img_comp[i].linebuf) {
         STBI_FREE(j->img_comp[i].linebuf);
         j->img_comp[i].linebuf = NULL;
      }
   }
}